

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.hpp
# Opt level: O1

unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridFourier>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridFourier> *this,AccelerationContext *acc,istream *is)

{
  long lVar1;
  int *piVar2;
  pointer piVar3;
  int *piVar4;
  undefined8 *puVar5;
  int num_entries;
  unsigned_long in_RCX;
  int *piVar6;
  int *piVar7;
  pointer *__ptr;
  int max_level;
  MultiIndexSet *mset;
  pointer piVar8;
  int v;
  undefined1 local_100 [16];
  vector<double,_std::allocator<double>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  puVar5 = (undefined8 *)operator_new(0x288);
  puVar5[1] = acc;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *(undefined4 *)(puVar5 + 4) = 0;
  puVar5[5] = 0;
  puVar5[6] = 0;
  puVar5[7] = 0;
  puVar5[8] = 0;
  *(undefined4 *)(puVar5 + 9) = 0;
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0xc] = 0;
  puVar5[0xd] = 0;
  puVar5[0xe] = 0;
  puVar5[0xf] = 0;
  puVar5[0x10] = 0;
  puVar5[0x11] = 0;
  *puVar5 = &PTR__GridFourier_001f6990;
  *(undefined1 *)(puVar5 + 0x12) = 0;
  *(undefined8 *)((long)puVar5 + 0x94) = 0;
  memset(puVar5 + 0x14,0,0xb4);
  puVar5[0x2b] = 0;
  puVar5[0x2c] = 0;
  puVar5[0x2d] = 0;
  puVar5[0x2e] = 0;
  *(undefined4 *)(puVar5 + 0x2f) = 0;
  puVar5[0x30] = 0;
  puVar5[0x31] = 0;
  puVar5[0x32] = 0;
  puVar5[0x33] = 0;
  puVar5[0x34] = 0;
  puVar5[0x35] = 0;
  *(undefined8 *)((long)puVar5 + 0x1ac) = 0;
  *(undefined8 *)((long)puVar5 + 0x1b4) = 0;
  puVar5[0x38] = 0;
  puVar5[0x39] = 0;
  puVar5[0x3a] = 0;
  puVar5[0x3b] = 0;
  *(undefined4 *)(puVar5 + 0x3c) = 0;
  memset(puVar5 + 0x3d,0,0xa0);
  *(undefined8 **)this = puVar5;
  ::std::istream::operator>>((istream *)is,(int *)local_100);
  *(undefined4 *)(puVar5 + 2) = local_100._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_100);
  *(undefined4 *)((long)puVar5 + 0x14) = local_100._0_4_;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_100,is);
  *(undefined4 *)(puVar5 + 0x2a) = local_100._8_4_;
  puVar5[0x29] = local_100._0_8_;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar5 + 0x2b),
             (vector<int,_std::allocator<int>_> *)&local_f0);
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_100,is);
  *(undefined4 *)(puVar5 + 0x2f) = local_100._8_4_;
  puVar5[0x2e] = local_100._0_8_;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar5 + 0x30),
             (vector<int,_std::allocator<int>_> *)&local_f0);
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_100,(IO *)is,
             (istream *)(ulong)*(uint *)(puVar5 + 0x2f),(int)in_RCX);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(puVar5 + 0x33),local_100);
  if ((pointer)local_100._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_100._0_8_,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start - local_100._0_8_);
  }
  ::std::istream::operator>>((istream *)is,(int *)local_100);
  if (local_100._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_100,is);
    *(undefined4 *)(puVar5 + 4) = local_100._8_4_;
    puVar5[3] = local_100._0_8_;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar5 + 5),
               (vector<int,_std::allocator<int>_> *)&local_f0);
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_100);
  if (local_100._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_100,is);
    *(undefined4 *)(puVar5 + 9) = local_100._8_4_;
    puVar5[8] = local_100._0_8_;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar5 + 10),
               (vector<int,_std::allocator<int>_> *)&local_f0);
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_100,(IO *)is,
             (istream *)(ulong)*(uint *)(puVar5 + 2),(int)in_RCX);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(puVar5 + 0x43),local_100);
  if ((pointer)local_100._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_100._0_8_,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start - local_100._0_8_);
  }
  if (0 < *(int *)((long)puVar5 + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)local_100,is);
    puVar5[0xd] = local_100._0_8_;
    puVar5[0xe] = local_100._8_8_;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(puVar5 + 0xf),&local_f0);
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::istream::operator>>((istream *)is,(int *)local_100);
    if (local_100._0_4_ != 0) {
      lVar1 = *(long *)this;
      piVar8 = (pointer)(long)*(int *)(lVar1 + 0x14);
      piVar3 = (pointer)((long)*(int *)(lVar1 + 0x20) * 2);
      IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
                (&local_48,(IO *)is,(istream *)((long)piVar3 * (long)piVar8),in_RCX);
      local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      *(pointer *)(lVar1 + 0x230) = piVar8;
      *(pointer *)(lVar1 + 0x238) = piVar3;
      local_100._0_8_ = piVar8;
      local_100._8_8_ = piVar3;
      ::std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x240),&local_f0);
      if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  num_entries = (int)in_RCX;
  ::std::istream::operator>>((istream *)is,(int *)local_100);
  if (local_100._0_4_ == 0) {
    piVar7 = *(int **)(*(long *)this + 0x218);
    piVar2 = *(int **)(*(long *)this + 0x220);
    piVar6 = piVar7 + 1;
    if (piVar6 != piVar2 && piVar7 != piVar2) {
      do {
        piVar4 = piVar6;
        if (*piVar6 <= *piVar7) {
          piVar4 = piVar7;
        }
        piVar7 = piVar4;
        piVar6 = piVar6 + 1;
      } while (piVar6 != piVar2);
    }
    max_level = *piVar7;
  }
  else {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_100,is);
    lVar1 = *(long *)this;
    *(undefined4 *)(lVar1 + 0x1b8) = local_100._8_4_;
    *(undefined8 *)(lVar1 + 0x1b0) = local_100._0_8_;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x1c0),
               (vector<int,_std::allocator<int>_> *)&local_f0);
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar7 = *(int **)(lVar1 + 0x1c0);
    piVar2 = piVar7;
    if (piVar7 == *(int **)(lVar1 + 0x1c8)) {
      max_level = 0;
    }
    else {
      while (piVar6 = piVar2, piVar7 = piVar7 + 1, piVar7 != *(int **)(lVar1 + 0x1c8)) {
        piVar2 = piVar7;
        if (*piVar7 <= *piVar6) {
          piVar2 = piVar6;
        }
      }
      num_entries = (int)piVar7;
      max_level = *piVar6;
    }
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_100,is);
    *(undefined4 *)(lVar1 + 0x1e0) = local_100._8_4_;
    *(undefined8 *)(lVar1 + 0x1d8) = local_100._0_8_;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x1e8),
               (vector<int,_std::allocator<int>_> *)&local_f0);
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
              ((vector<int,_std::allocator<int>_> *)local_100,(IO *)is,
               (istream *)(ulong)*(uint *)(lVar1 + 0x1e0),num_entries);
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x200),local_100);
    if ((pointer)local_100._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_100._0_8_,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_100._0_8_);
    }
  }
  OneDimensionalWrapper::OneDimensionalWrapper
            ((OneDimensionalWrapper *)local_100,max_level,rule_fourier,0.0,0.0);
  lVar1 = *(long *)this;
  *(undefined4 *)(lVar1 + 0x98) = local_100._8_4_;
  *(undefined8 *)(lVar1 + 0x90) = local_100._0_8_;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0xa0),
             (vector<int,_std::allocator<int>_> *)&local_f0);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0xb8),&local_d8);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0xd0),&local_c0);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar1 + 0xe8),&local_a8);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar1 + 0x100),&local_90);
  ::std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x118),&local_78);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar1 + 0x130),&local_60);
  OneDimensionalWrapper::~OneDimensionalWrapper((OneDimensionalWrapper *)local_100);
  mset = (MultiIndexSet *)(lVar1 + 0x18);
  if (*(long *)(lVar1 + 0x28) == *(long *)(lVar1 + 0x30)) {
    mset = (MultiIndexSet *)(lVar1 + 0x40);
  }
  MultiIndexManipulations::getMaxIndexes((vector<int,_std::allocator<int>_> *)local_100,mset);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(lVar1 + 600),local_100);
  if ((pointer)local_100._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_100._0_8_,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start - local_100._0_8_);
  }
  return (__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridFourier> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridFourier> grid = Utils::make_unique<GridFourier>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);

        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0){
            grid->values = StorageSet(is, iomode());
            if (IO::readFlag<iomode>(is))
                grid->fourier_coefs = IO::readData2D<iomode, double>(is, grid->num_outputs, 2 * grid->points.getNumIndexes());
        }

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(oned_max_level, rule_fourier, 0.0, 0.0);

        grid->max_power = MultiIndexManipulations::getMaxIndexes(((grid->points.empty()) ? grid->needed : grid->points));

        return grid;
    }